

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d54c::SwiftCompilerShellCommand::getVerboseDescription
          (SwiftCompilerShellCommand *this,SmallVectorImpl<char> *result)

{
  size_t __n;
  char *__s;
  pointer pSVar1;
  bool bVar2;
  void *pvVar3;
  long lVar4;
  raw_ostream *prVar5;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__n_00;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  void *__buf;
  char *extraout_RDX_03;
  char *__buf_00;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2;
  StringRef *arg;
  pointer pSVar6;
  StringRef outputFileMapPath_00;
  StringRef Str;
  StringRef Str_00;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  raw_svector_ostream os;
  SmallString<64U> outputFileMapPath;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_c8;
  raw_ostream local_b0;
  SmallVectorImpl<char> *local_88;
  SmallVectorImpl<char> local_80;
  undefined1 local_70 [64];
  
  __n_00 = &local_c8;
  local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_70;
  local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x40;
  getOutputFileMapPath(this,&local_80);
  local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (StringRef *)0x0;
  local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (StringRef *)0x0;
  outputFileMapPath_00.Length._0_4_ =
       local_80.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  outputFileMapPath_00.Data =
       (char *)local_80.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  outputFileMapPath_00.Length._4_4_ = 0;
  constructCommandLineArgs(this,outputFileMapPath_00,&local_c8);
  local_b0.BufferMode = InternalBuffer;
  local_b0.OutBufStart = (char *)0x0;
  local_b0.OutBufEnd = (char *)0x0;
  local_b0.OutBufCur = (char *)0x0;
  local_b0._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_001e81c0;
  local_88 = result;
  llvm::raw_ostream::SetUnbuffered(&local_b0);
  pSVar1 = local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
    __buf_00 = extraout_RDX;
    pSVar6 = local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (!bVar2) {
        Str.Length = 1;
        Str.Data = " ";
        llvm::raw_ostream::operator<<(&local_b0,Str);
        __buf_00 = extraout_RDX_00;
      }
      __n = pSVar6->Length;
      if (__n == 0) {
LAB_0012343b:
        lVar4 = -1;
      }
      else {
        __s = pSVar6->Data;
        pvVar3 = memchr(__s,0x20,__n);
        __buf_00 = extraout_RDX_01;
        if (pvVar3 == (void *)0x0) goto LAB_0012343b;
        lVar4 = (long)pvVar3 - (long)__s;
      }
      if (lVar4 == -1) {
        Str_00.Length = __n;
        Str_00.Data = pSVar6->Data;
        llvm::raw_ostream::operator<<(&local_b0,Str_00);
        __buf_00 = extraout_RDX_02;
      }
      else {
        if (local_b0.OutBufCur < local_b0.OutBufEnd) {
          *local_b0.OutBufCur = '\"';
          prVar5 = &local_b0;
          local_b0.OutBufCur = local_b0.OutBufCur + 1;
        }
        else {
          prVar5 = (raw_ostream *)llvm::raw_ostream::write(&local_b0,0x22,__buf_00,(size_t)__n_00);
        }
        prVar5 = llvm::raw_ostream::operator<<(prVar5,*pSVar6);
        __n_00 = (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)prVar5->OutBufCur;
        if (__n_00 < prVar5->OutBufEnd) {
          __buf_00 = (char *)((long)__n_00 + 1);
          prVar5->OutBufCur = __buf_00;
          *(char *)__n_00 = '\"';
        }
        else {
          llvm::raw_ostream::write(prVar5,0x22,__buf,(size_t)__n_00);
          __buf_00 = extraout_RDX_03;
        }
      }
      pSVar6 = pSVar6 + 1;
      bVar2 = false;
    } while (pSVar6 != pSVar1);
  }
  llvm::raw_ostream::~raw_ostream(&local_b0);
  if (local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (StringRef *)0x0) {
    operator_delete(local_c8.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)
      local_80.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_70) {
    free(local_80.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);
    
    llvm::raw_svector_ostream os(result);
    bool first = true;
    for (const auto& arg: commandLine) {
      if (!first) os << " ";
      first = false;
      // FIXME: This isn't correct, we need utilities for doing shell quoting.
      if (arg.find(' ') != StringRef::npos) {
        os << '"' << arg << '"';
      } else {
        os << arg;
      }
    }
  }